

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

undefined8 QFontDialog::getFont(bool *ok,QWidget *parent)

{
  QString *in_RDX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QFont initial;
  QWidget *parent_00;
  QFont *this;
  QString *ok_00;
  QFlagsStorage<QFontDialog::FontDialogOption> in_stack_ffffffffffffffdc;
  undefined1 *local_18;
  QWidgetData *pQStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_10 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QFont *)&local_18;
  QFont::QFont(this);
  parent_00 = (QWidget *)&stack0xffffffffffffffd0;
  ok_00 = in_RDX;
  QString::QString((QString *)0x795176);
  QFlags<QFontDialog::FontDialogOption>::QFlags((QFlags<QFontDialog::FontDialogOption> *)0x795188);
  QFontDialogPrivate::getFont
            ((bool *)ok_00,this,parent_00,in_RDX,(FontDialogOptions)in_stack_ffffffffffffffdc.i);
  QString::~QString((QString *)0x7951b5);
  QFont::~QFont(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QFont QFontDialog::getFont(bool *ok, QWidget *parent)
{
    QFont initial;
    return QFontDialogPrivate::getFont(ok, initial, parent, QString(), { });
}